

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRound.h
# Opt level: O2

void __thiscall
TimeRound<channel>::AddTimeRoundItemNode
          (TimeRound<channel> *this,SP_TimeRoundItemNode<channel> *time_round_item_node)

{
  pointer ppSVar1;
  int iVar2;
  ostream *poVar3;
  SP_TimeRoundItemList<channel> *pSVar4;
  element_type *peVar5;
  int iVar6;
  Lock_Guard lock;
  
  Lock_Guard::Lock_Guard(&lock,&this->Mutex);
  if (time_round_item_node != (SP_TimeRoundItemNode<channel> *)0x0) {
    peVar5 = (time_round_item_node->Item).
             super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = peVar5->time_threod;
    if (iVar2 < 1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(time_round_item_node->Item).
                  super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      operator_delete(time_round_item_node);
    }
    else {
      iVar6 = this->max_time;
      if (iVar6 <= iVar2) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "TimeOut time is larger than the max_time of TimeRound,Set to the max_time-1"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar6 = this->max_time;
        iVar2 = iVar6 + -1;
        peVar5 = (time_round_item_node->Item).
                 super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      iVar6 = (iVar2 + this->cur_index) % iVar6;
      peVar5->index = iVar6;
      ppSVar1 = (this->TimeRoundVector).
                super__Vector_base<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 = ppSVar1[iVar6];
      if (pSVar4 == (SP_TimeRoundItemList<channel> *)0x0) {
        pSVar4 = (SP_TimeRoundItemList<channel> *)operator_new(0x10);
        pSVar4->head = (SP_TimeRoundItemNode<channel> *)0x0;
        pSVar4->tail = (SP_TimeRoundItemNode<channel> *)0x0;
        ppSVar1[iVar6] = pSVar4;
        ppSVar1 = (this->TimeRoundVector).
                  super__Vector_base<SP_TimeRoundItemList<channel>_*,_std::allocator<SP_TimeRoundItemList<channel>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppSVar1[iVar6]->head = time_round_item_node;
        pSVar4 = ppSVar1[iVar6];
      }
      else {
        if (pSVar4->head == (SP_TimeRoundItemNode<channel> *)0x0) {
          pSVar4->head = time_round_item_node;
        }
        else {
          pSVar4->tail->next = time_round_item_node;
          time_round_item_node->pre = ppSVar1[iVar6]->tail;
        }
        pSVar4 = ppSVar1[iVar6];
      }
      pSVar4->tail = time_round_item_node;
    }
  }
  Lock_Guard::~Lock_Guard(&lock);
  return;
}

Assistant:

void AddTimeRoundItemNode(SP_TimeRoundItemNode<T>* time_round_item_node)
        {
            Lock_Guard lock(Mutex);
            if(time_round_item_node == nullptr)
            {
                return;
            }
            int time = time_round_item_node->Item->GetTimeThreod();
            if(time <= 0)
            {
                delete time_round_item_node;
                return;
            }
            if(time >= max_time)
            {
                cout<<"TimeOut time is larger than the max_time of TimeRound,Set to the max_time-1"<<endl;
                time = max_time-1;
            }
            int index = (cur_index + time) % max_time;
            time_round_item_node->Item->SetIndex(index);

            if(TimeRoundVector[index] == nullptr)
            {
                TimeRoundVector[index] = new SP_TimeRoundItemList<T>();
                TimeRoundVector[index]->head = time_round_item_node;
                TimeRoundVector[index]->tail = time_round_item_node;
            }
            else
            {
                if(TimeRoundVector[index]->head != nullptr)
                {
                    TimeRoundVector[index]->tail->next = time_round_item_node;
                    time_round_item_node->pre = TimeRoundVector[index]->tail;
                    TimeRoundVector[index]->tail = time_round_item_node;
                }
                else
                {
                    TimeRoundVector[index]->head = time_round_item_node;
                    TimeRoundVector[index]->tail = time_round_item_node;
                }
            }
        }